

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c++
# Opt level: O2

bool capnp::compiler::lex(ArrayPtr<const_char> input,Builder result,ErrorReporter *errorReporter)

{
  int iVar1;
  Builder builder;
  char *pcVar2;
  char *pcVar3;
  char (*params) [13];
  char *pcVar4;
  undefined8 in_R9;
  uint uVar5;
  Orphanage orphanageParam;
  Builder l;
  ParserInput parserInput;
  Sequence_<const_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Statement>_>_>_&,_const_kj::parse::EndOfInput__&>
  parser;
  Lexer lexer;
  SegmentBuilder *pSVar6;
  CapTableBuilder *pCVar7;
  void *pvVar8;
  WirePointer *pWVar9;
  undefined8 uVar10;
  bool local_130;
  undefined8 local_128;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined8 in_stack_fffffffffffffee8;
  SegmentBuilder *in_stack_fffffffffffffef0;
  CapTableBuilder *in_stack_fffffffffffffef8;
  ArrayDisposer *in_stack_ffffffffffffff00;
  ParserInput local_e8;
  Sequence_<const_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Statement>_>_>_&,_const_kj::parse::EndOfInput__&>
  local_c0;
  Lexer local_a8;
  
  pcVar4 = input.ptr;
  builder._builder.segment._4_4_ = in_stack_fffffffffffffee4;
  builder._builder.segment._0_4_ = in_stack_fffffffffffffee0;
  builder._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffee8;
  builder._builder.data = in_stack_fffffffffffffef0;
  builder._builder.pointers = (WirePointer *)in_stack_fffffffffffffef8;
  builder._builder._32_8_ = in_stack_ffffffffffffff00;
  pSVar6 = result._builder.segment;
  pCVar7 = result._builder.capTable;
  pvVar8 = result._builder.data;
  pWVar9 = result._builder.pointers;
  uVar10 = result._builder._32_8_;
  orphanageParam =
       Orphanage::getForMessageContaining<capnp::compiler::LexedStatements::Builder>(builder);
  Lexer::Lexer(&local_a8,orphanageParam,errorReporter);
  local_c0.first = &local_a8.parsers.statementSequence;
  local_c0.rest.first = (EndOfInput_ *)&kj::parse::endOfInput;
  local_e8.super_IteratorInput<char,_const_char_*>.end = pcVar4 + input.size_;
  local_e8.super_IteratorInput<char,_const_char_*>.parent = (IteratorInput<char,_const_char_*> *)0x0
  ;
  local_e8.super_IteratorInput<char,_const_char_*>.pos = pcVar4;
  local_e8.super_IteratorInput<char,_const_char_*>.best = pcVar4;
  local_e8.begin = pcVar4;
  kj::parse::
  Sequence_<const_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Statement>_>_>_&,_const_kj::parse::EndOfInput__&>
  ::parseNext<capnp::compiler::Lexer::ParserInput>
            ((Maybe<kj::Array<capnp::Orphan<capnp::compiler::Statement>_>_> *)&local_130,&local_c0,
             &local_e8);
  pcVar3 = local_e8.begin;
  pcVar2 = local_e8.super_IteratorInput<char,_const_char_*>.best;
  pcVar4 = local_e8.super_IteratorInput<char,_const_char_*>.pos;
  if (local_130 == true) {
    LexedStatements::Builder::initStatements
              ((Builder *)&stack0xfffffffffffffef0,&result,in_stack_fffffffffffffee0);
    for (uVar5 = 0; (ulong)uVar5 < CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0);
        uVar5 = uVar5 + 1) {
      List<capnp::compiler::Statement,_(capnp::Kind)3>::Builder::adoptWithCaveats
                ((Builder *)&stack0xfffffffffffffef0,uVar5,
                 (Orphan<capnp::compiler::Statement> *)(local_128 + (ulong)uVar5 * 0x20));
    }
  }
  else {
    kj::str<char_const(&)[13]>((String *)&stack0xfffffffffffffef0,(kj *)"Parse error.",params);
    iVar1 = (int)pcVar2;
    if (pcVar2 < pcVar4) {
      iVar1 = (int)pcVar4;
    }
    uVar5 = iVar1 - (int)pcVar3;
    if (in_stack_fffffffffffffef8 == (CapTableBuilder *)0x0) {
      in_stack_fffffffffffffef0 = (SegmentBuilder *)0x20b013;
    }
    (**errorReporter->_vptr_ErrorReporter)
              (errorReporter,(ulong)uVar5,(ulong)uVar5,in_stack_fffffffffffffef0,
               (long)&(in_stack_fffffffffffffef8->super_CapTableReader)._vptr_CapTableReader +
               (ulong)(in_stack_fffffffffffffef8 == (CapTableBuilder *)0x0),in_R9,pSVar6,pCVar7,
               pvVar8,pWVar9,uVar10);
    kj::Array<char>::~Array((Array<char> *)&stack0xfffffffffffffef0);
  }
  kj::_::NullableValue<kj::Array<capnp::Orphan<capnp::compiler::Statement>_>_>::~NullableValue
            ((NullableValue<kj::Array<capnp::Orphan<capnp::compiler::Statement>_>_> *)&local_130);
  kj::parse::IteratorInput<char,_const_char_*>::~IteratorInput
            (&local_e8.super_IteratorInput<char,_const_char_*>);
  kj::Arena::~Arena(&local_a8.arena);
  return local_130;
}

Assistant:

bool lex(kj::ArrayPtr<const char> input, LexedStatements::Builder result,
         ErrorReporter& errorReporter) {
  Lexer lexer(Orphanage::getForMessageContaining(result), errorReporter);

  auto parser = p::sequence(lexer.getParsers().statementSequence, p::endOfInput);

  Lexer::ParserInput parserInput(input.begin(), input.end());
  kj::Maybe<kj::Array<Orphan<Statement>>> parseOutput = parser(parserInput);

  KJ_IF_SOME(output, parseOutput) {
    auto l = result.initStatements(output.size());
    for (uint i = 0; i < output.size(); i++) {
      l.adoptWithCaveats(i, kj::mv((output)[i]));
    }
    return true;
  } else {
    uint32_t best = parserInput.getBest();
    errorReporter.addError(best, best, kj::str("Parse error."));
    return false;
  }